

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<QPersistentModelIndex,_QEditorInfo> * __thiscall
QHashPrivate::iterator<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_>::node
          (iterator<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *this)

{
  Span *pSVar1;
  ulong uVar2;
  
  pSVar1 = this->d->spans;
  uVar2 = this->bucket >> 7;
  return (Node<QPersistentModelIndex,_QEditorInfo> *)
         (pSVar1[uVar2].entries + pSVar1[uVar2].offsets[(uint)this->bucket & 0x7f]);
}

Assistant:

inline Node *node() const noexcept
    {
        Q_ASSERT(!isUnused());
        return &d->spans[span()].at(index());
    }